

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint _c;
  float fVar5;
  size_t _elemsize;
  unsigned_short uVar6;
  int iVar7;
  float *pfVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int z;
  long lVar12;
  int iVar13;
  int iVar14;
  uint _c_00;
  int iVar15;
  int iVar16;
  ulong uVar17;
  anon_union_4_2_947300b0 tmp;
  undefined1 auVar18 [16];
  Mat borderm;
  Mat m;
  Mat local_78;
  
  uVar1 = this->left;
  uVar3 = this->right;
  uVar2 = this->front;
  uVar4 = this->behind;
  auVar18._0_4_ = -(uint)(uVar1 == 0);
  auVar18._4_4_ = -(uint)(uVar3 == 0);
  auVar18._8_4_ = -(uint)(uVar2 == 0);
  auVar18._12_4_ = -(uint)(uVar4 == 0);
  iVar14 = movmskps((int)this,auVar18);
  if ((this->bottom == 0 && this->top == 0) && iVar14 == 0xf) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    iVar14 = bottom_blob->dims;
    _elemsize = bottom_blob->elemsize;
    iVar13 = uVar3 + uVar1 + bottom_blob->w;
    if (iVar14 == 1) {
      Mat::create(top_blob,iVar13,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_make_border_image<float>(bottom_blob,top_blob,0,this->left,this->type,this->value);
        return 0;
      }
      if (_elemsize != 2) {
        if (_elemsize != 1) {
          return 0;
        }
        copy_make_border_image<signed_char>
                  (bottom_blob,top_blob,0,this->left,this->type,(char)(int)this->value);
        return 0;
      }
      iVar14 = this->left;
      iVar13 = this->type;
      if (((this->super_Layer).support_fp16_storage == true) && (opt->use_fp16_storage == true)) {
        uVar6 = float32_to_float16(this->value);
      }
      else {
        uVar6 = *(unsigned_short *)((long)&this->value + 2);
      }
      copy_make_border_image<unsigned_short>(bottom_blob,top_blob,0,iVar14,iVar13,uVar6);
      return 0;
    }
    _c = bottom_blob->c;
    uVar17 = (ulong)_c;
    iVar10 = this->bottom + this->top + bottom_blob->h;
    if (iVar14 == 4) {
      iVar14 = bottom_blob->d;
      iVar9 = uVar4 + uVar2 + iVar14;
      Mat::create(top_blob,iVar13,iVar10,iVar9,_c,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      iVar13 = iVar14 + -1;
      if ((int)_c < 1) {
        uVar17 = 0;
      }
      for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
        pfVar8 = (float *)(uVar11 * 4 + (long)(this->per_channel_pad_data).data);
        if (this->per_channel_pad_data_size == 0) {
          pfVar8 = &this->value;
        }
        fVar5 = *pfVar8;
        for (iVar10 = 0; iVar9 != iVar10; iVar10 = iVar10 + 1) {
          Mat::channel(&m,top_blob,(int)uVar11);
          Mat::depth(&borderm,&m,iVar10);
          Mat::~Mat(&m);
          iVar7 = this->type;
          iVar16 = this->front;
          iVar15 = iVar10 - iVar16;
          uVar6 = (unsigned_short)((uint)fVar5 >> 0x10);
          if (iVar7 == 0 && (iVar16 + iVar14 <= iVar10 || iVar10 < iVar16)) {
            if (_elemsize == 4) {
              Mat::fill(&borderm,fVar5);
            }
            else if (_elemsize == 2) {
              if (((this->super_Layer).support_fp16_storage == true) &&
                 (opt->use_fp16_storage == true)) {
                uVar6 = float32_to_float16(fVar5);
              }
              Mat::fill<unsigned_short>(&borderm,uVar6);
            }
            else if (_elemsize == 1) {
              Mat::fill<signed_char>(&borderm,(char)(int)fVar5);
            }
          }
          else {
            if (iVar7 == 1) {
              if (iVar15 < 1) {
                iVar15 = 0;
              }
              if (iVar13 <= iVar15) {
                iVar15 = iVar13;
              }
            }
            else if (iVar7 == 2) {
              iVar7 = -iVar15;
              if (0 < iVar15) {
                iVar7 = iVar15;
              }
              iVar7 = iVar7 - iVar13;
              iVar16 = -iVar7;
              if (iVar7 < 1) {
                iVar16 = iVar7;
              }
              iVar15 = iVar16 + iVar13;
            }
            Mat::channel(&local_78,bottom_blob,(int)uVar11);
            Mat::depth(&m,&local_78,iVar15);
            Mat::~Mat(&local_78);
            if (_elemsize == 4) {
              copy_make_border_image<float>(&m,&borderm,this->top,this->left,this->type,fVar5);
            }
            else if (_elemsize == 2) {
              iVar7 = this->top;
              iVar16 = this->left;
              iVar15 = this->type;
              if (((this->super_Layer).support_fp16_storage == true) &&
                 (opt->use_fp16_storage == true)) {
                uVar6 = float32_to_float16(fVar5);
              }
              copy_make_border_image<unsigned_short>(&m,&borderm,iVar7,iVar16,iVar15,uVar6);
            }
            else if (_elemsize == 1) {
              copy_make_border_image<signed_char>
                        (&m,&borderm,this->top,this->left,this->type,(char)(int)fVar5);
            }
            Mat::~Mat(&m);
          }
          Mat::~Mat(&borderm);
        }
      }
    }
    else if (iVar14 == 3) {
      _c_00 = uVar4 + uVar2 + _c;
      Mat::create(top_blob,iVar13,iVar10,_c_00,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar14 = _c - 1;
      if ((int)_c_00 < 1) {
        _c_00 = 0;
      }
      lVar12 = 0;
      for (uVar17 = 0; _c_00 != uVar17; uVar17 = uVar17 + 1) {
        Mat::channel(&borderm,top_blob,(int)uVar17);
        pfVar8 = (float *)((long)(this->per_channel_pad_data).data + lVar12);
        if (this->per_channel_pad_data_size == 0) {
          pfVar8 = &this->value;
        }
        fVar5 = *pfVar8;
        iVar13 = this->type;
        iVar10 = this->front;
        uVar6 = (unsigned_short)((uint)fVar5 >> 0x10);
        if (iVar13 == 0 && ((long)(int)(iVar10 + _c) <= (long)uVar17 || (long)uVar17 < (long)iVar10)
           ) {
          if (_elemsize == 4) {
            Mat::fill(&borderm,fVar5);
          }
          else if (_elemsize == 2) {
            if (((this->super_Layer).support_fp16_storage == true) &&
               (opt->use_fp16_storage == true)) {
              uVar6 = float32_to_float16(fVar5);
            }
            Mat::fill<unsigned_short>(&borderm,uVar6);
          }
          else if (_elemsize == 1) {
            Mat::fill<signed_char>(&borderm,(char)(int)fVar5);
          }
        }
        else {
          iVar10 = (int)uVar17 - iVar10;
          if (iVar13 == 1) {
            if (iVar10 < 1) {
              iVar10 = 0;
            }
            if (iVar14 <= iVar10) {
              iVar10 = iVar14;
            }
          }
          else if (iVar13 == 2) {
            iVar13 = -iVar10;
            if (0 < iVar10) {
              iVar13 = iVar10;
            }
            iVar13 = iVar13 - iVar14;
            iVar10 = -iVar13;
            if (iVar13 < 1) {
              iVar10 = iVar13;
            }
            iVar10 = iVar10 + iVar14;
          }
          Mat::channel(&m,bottom_blob,iVar10);
          if (_elemsize == 4) {
            copy_make_border_image<float>(&m,&borderm,this->top,this->left,this->type,fVar5);
          }
          else if (_elemsize == 2) {
            iVar13 = this->top;
            iVar10 = this->left;
            iVar9 = this->type;
            if (((this->super_Layer).support_fp16_storage == true) &&
               (opt->use_fp16_storage == true)) {
              uVar6 = float32_to_float16(fVar5);
            }
            copy_make_border_image<unsigned_short>(&m,&borderm,iVar13,iVar10,iVar9,uVar6);
          }
          else if (_elemsize == 1) {
            copy_make_border_image<signed_char>
                      (&m,&borderm,this->top,this->left,this->type,(char)(int)fVar5);
          }
          Mat::~Mat(&m);
        }
        Mat::~Mat(&borderm);
        lVar12 = lVar12 + 4;
      }
    }
    else if (iVar14 == 2) {
      Mat::create(top_blob,iVar13,iVar10,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_make_border_image<float>
                  (bottom_blob,top_blob,this->top,this->left,this->type,this->value);
      }
      else if (_elemsize == 2) {
        iVar14 = this->top;
        iVar13 = this->left;
        iVar10 = this->type;
        if (((this->super_Layer).support_fp16_storage == true) && (opt->use_fp16_storage == true)) {
          uVar6 = float32_to_float16(this->value);
        }
        else {
          uVar6 = *(unsigned_short *)((long)&this->value + 2);
        }
        copy_make_border_image<unsigned_short>(bottom_blob,top_blob,iVar14,iVar13,iVar10,uVar6);
      }
      else if (_elemsize == 1) {
        copy_make_border_image<signed_char>
                  (bottom_blob,top_blob,this->top,this->left,this->type,(char)(int)this->value);
      }
    }
  }
  return 0;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, 0, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(value) : float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(value) : float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        int outc = channels + front + behind;

        top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat borderm = top_blob.channel(q);

            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            //Channel padding
            if (((q < front) || (q >= (channels + front))) && type == 0)
            {
                if (elemsize == 1)
                {
                    borderm.fill(static_cast<signed char>(pad_value));
                }
                if (elemsize == 2)
                {
                    borderm.fill(support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                }
                if (elemsize == 4)
                {
                    borderm.fill(pad_value);
                }
            }
            else
            {
                int q_ = q - front;

                if (type == 1)
                {
                    q_ = q_ <= 0 ? 0 : q_;
                    q_ = q_ >= channels - 1 ? channels - 1 : q_;
                }
                if (type == 2)
                {
                    q_ = abs(q_);
                    q_ = (channels - 1) - abs(q_ - (channels - 1));
                }
                const Mat m = bottom_blob.channel(q_);
                if (elemsize == 1)
                    copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
                if (elemsize == 2)
                    copy_make_border_image<unsigned short>(m, borderm, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                if (elemsize == 4)
                    copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outd = d + front + behind;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            for (int z = 0; z < outd; z++)
            {
                Mat borderm = top_blob.channel(q).depth(z);

                // depth padding
                if (((z < front) || (z >= (d + front))) && type == 0)
                {
                    if (elemsize == 1)
                    {
                        borderm.fill(static_cast<signed char>(pad_value));
                    }
                    if (elemsize == 2)
                    {
                        borderm.fill(support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                    }
                    if (elemsize == 4)
                    {
                        borderm.fill(pad_value);
                    }
                }
                else
                {
                    int z_ = z - front;

                    if (type == 1)
                    {
                        z_ = z_ <= 0 ? 0 : z_;
                        z_ = z_ >= d - 1 ? d - 1 : z_;
                    }
                    if (type == 2)
                    {
                        z_ = abs(z_);
                        z_ = (d - 1) - abs(z_ - (d - 1));
                    }
                    const Mat m = bottom_blob.channel(q).depth(z_);
                    if (elemsize == 1)
                        copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
                    if (elemsize == 2)
                        copy_make_border_image<unsigned short>(m, borderm, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                    if (elemsize == 4)
                        copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
                }
            }
        }

        return 0;
    }

    return 0;
}